

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void NV12ToRGB565Row_C(uint8_t *src_y,uint8_t *src_uv,uint8_t *dst_rgb565,YuvConstants *yuvconstants
                      ,int width)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *in_RDX;
  uint8_t *in_RSI;
  uint8_t *in_RDI;
  uint in_R8D;
  uint8_t unaff_retaddr;
  uint8_t unaff_retaddr_00;
  uint8_t unaff_retaddr_01;
  int x;
  uint8_t r1;
  uint8_t g1;
  uint8_t b1;
  uint8_t r0;
  uint8_t g0;
  uint8_t b0;
  int local_30;
  byte local_2a;
  byte local_29;
  byte local_28;
  byte local_27;
  byte local_26;
  byte local_25;
  
  for (local_30 = 0; local_30 < (int)(in_R8D - 1); local_30 = local_30 + 2) {
    libyuv::YuvPixel(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI,(uint8_t *)in_RDX
                     ,(YuvConstants *)CONCAT44(width,_b1));
    libyuv::YuvPixel(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI,(uint8_t *)in_RDX
                     ,(YuvConstants *)CONCAT44(width,_b1));
    uVar1 = (uint)local_25;
    local_25 = (byte)((int)uVar1 >> 3);
    uVar2 = (uint)local_26;
    local_26 = (byte)((int)uVar2 >> 2);
    uVar3 = (uint)local_27;
    local_27 = (byte)((int)uVar3 >> 3);
    uVar4 = (uint)local_28;
    local_28 = (byte)((int)uVar4 >> 3);
    uVar5 = (uint)local_29;
    local_29 = (byte)((int)uVar5 >> 2);
    uVar6 = (uint)local_2a;
    local_2a = (byte)((int)uVar6 >> 3);
    *in_RDX = (int)uVar1 >> 3 | ((int)uVar2 >> 2) << 5 | ((int)uVar3 >> 3) << 0xb |
              ((int)uVar4 >> 3) << 0x10 | ((int)uVar5 >> 2) << 0x15 | ((int)uVar6 >> 3) << 0x1b;
    in_RDI = in_RDI + 2;
    in_RSI = in_RSI + 2;
    in_RDX = in_RDX + 1;
  }
  if ((in_R8D & 1) != 0) {
    libyuv::YuvPixel(unaff_retaddr_01,unaff_retaddr_00,unaff_retaddr,in_RDI,in_RSI,(uint8_t *)in_RDX
                     ,(YuvConstants *)CONCAT44(width,_b1));
    *(ushort *)in_RDX =
         (ushort)(byte)((int)(uint)local_25 >> 3) | (ushort)(byte)((int)(uint)local_26 >> 2) << 5 |
         (ushort)(byte)((int)(uint)local_27 >> 3) << 0xb;
  }
  return;
}

Assistant:

void NV12ToRGB565Row_C(const uint8_t* src_y,
                       const uint8_t* src_uv,
                       uint8_t* dst_rgb565,
                       const struct YuvConstants* yuvconstants,
                       int width) {
  uint8_t b0;
  uint8_t g0;
  uint8_t r0;
  uint8_t b1;
  uint8_t g1;
  uint8_t r1;
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_y[0], src_uv[0], src_uv[1], &b0, &g0, &r0, yuvconstants);
    YuvPixel(src_y[1], src_uv[0], src_uv[1], &b1, &g1, &r1, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    b1 = b1 >> 3;
    g1 = g1 >> 2;
    r1 = r1 >> 3;
    *(uint32_t*)(dst_rgb565) =
        b0 | (g0 << 5) | (r0 << 11) | (b1 << 16) | (g1 << 21) | (r1 << 27);
    src_y += 2;
    src_uv += 2;
    dst_rgb565 += 4;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_y[0], src_uv[0], src_uv[1], &b0, &g0, &r0, yuvconstants);
    b0 = b0 >> 3;
    g0 = g0 >> 2;
    r0 = r0 >> 3;
    *(uint16_t*)(dst_rgb565) = b0 | (g0 << 5) | (r0 << 11);
  }
}